

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int typed_array_init(JSContext *ctx,JSValue obj,JSValue buffer,uint64_t offset,uint64_t len)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  JSValueUnion JVar6;
  int iVar7;
  JSValueUnion JVar8;
  JSRefCountHeader *p;
  JSValue v;
  
  JVar6 = (JSValueUnion)obj.tag;
  JVar8 = obj.u;
  bVar1 = "includes"[(ulong)*(ushort *)((long)JVar8.ptr + 6) + 1];
  plVar5 = (long *)js_malloc(ctx,0x28);
  if (plVar5 == (long *)0x0) {
    iVar7 = -1;
    if ((0xfffffff4 < buffer.u._0_4_) &&
       (iVar2 = *JVar6.ptr, *(int *)JVar6.ptr = iVar2 + -1, iVar2 < 2)) {
      v.tag = (int64_t)buffer.u.ptr;
      v.u.ptr = JVar6.ptr;
      __JS_FreeValueRT(ctx->rt,v);
    }
  }
  else {
    lVar3 = *(long *)((long)JVar6.ptr + 0x30);
    ((JSValueUnion *)(plVar5 + 2))->ptr = (void *)JVar8;
    ((JSValueUnion *)(plVar5 + 3))->ptr = (void *)JVar6;
    *(int *)(plVar5 + 4) = (int)buffer.tag;
    *(int *)((long)plVar5 + 0x24) = (int)(offset << (bVar1 & 0x3f));
    lVar4 = *(long *)(lVar3 + 0x10);
    *(long **)(lVar4 + 8) = plVar5;
    *plVar5 = lVar4;
    plVar5[1] = lVar3 + 0x10;
    *(long **)(lVar3 + 0x10) = plVar5;
    *(long **)((long)JVar8.ptr + 0x30) = plVar5;
    *(int *)((long)JVar8.ptr + 0x40) = (int)offset;
    *(int64_t *)((long)JVar8.ptr + 0x38) = buffer.tag + *(long *)(lVar3 + 8);
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int typed_array_init(JSContext *ctx, JSValueConst obj,
                            JSValue buffer, uint64_t offset, uint64_t len)
{
    JSTypedArray *ta;
    JSObject *p, *pbuffer;
    JSArrayBuffer *abuf;
    int size_log2;

    p = JS_VALUE_GET_OBJ(obj);
    size_log2 = typed_array_size_log2(p->class_id);
    ta = js_malloc(ctx, sizeof(*ta));
    if (!ta) {
        JS_FreeValue(ctx, buffer);
        return -1;
    }
    pbuffer = JS_VALUE_GET_OBJ(buffer);
    abuf = pbuffer->u.array_buffer;
    ta->obj = p;
    ta->buffer = pbuffer;
    ta->offset = offset;
    ta->length = len << size_log2;
    list_add_tail(&ta->link, &abuf->array_list);
    p->u.typed_array = ta;
    p->u.array.count = len;
    p->u.array.u.ptr = abuf->data + offset;
    return 0;
}